

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

void xmlCatalogSetDefaults(xmlCatalogAllow allow)

{
  int iVar1;
  xmlGenericErrorFunc p_Var2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  
  if (allow < 4 && xmlDebugCatalogs != 0) {
    iVar1 = *(int *)(&DAT_001e98f4 + (ulong)allow * 4);
    pp_Var3 = __xmlGenericError();
    p_Var2 = *pp_Var3;
    ppvVar4 = __xmlGenericErrorContext();
    (*p_Var2)(*ppvVar4,&DAT_001e98f4 + iVar1);
  }
  xmlCatalogDefaultAllow = allow;
  return;
}

Assistant:

void
xmlCatalogSetDefaults(xmlCatalogAllow allow) {
    if (xmlDebugCatalogs) {
	switch (allow) {
	    case XML_CATA_ALLOW_NONE:
		xmlGenericError(xmlGenericErrorContext,
			"Disabling catalog usage\n");
		break;
	    case XML_CATA_ALLOW_GLOBAL:
		xmlGenericError(xmlGenericErrorContext,
			"Allowing only global catalogs\n");
		break;
	    case XML_CATA_ALLOW_DOCUMENT:
		xmlGenericError(xmlGenericErrorContext,
			"Allowing only catalogs from the document\n");
		break;
	    case XML_CATA_ALLOW_ALL:
		xmlGenericError(xmlGenericErrorContext,
			"Allowing all catalogs\n");
		break;
	}
    }
    xmlCatalogDefaultAllow = allow;
}